

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::insertSkipComponents
          (XFBGetProgramResourceAPITest *this,int num_components,NameVector *varyings)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = num_components % 4;
  uVar3 = 0;
  if (0 < (int)((long)num_components / 4)) {
    uVar3 = (long)num_components / 4 & 0xffffffff;
  }
  while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"gl_SkipComponents4",&local_51);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)varyings,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (iVar1 == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"gl_SkipComponents1",&local_51);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)varyings,
               &local_50);
  }
  else if (iVar1 == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"gl_SkipComponents2",&local_51);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)varyings,
               &local_50);
  }
  else {
    if (iVar1 != 3) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"gl_SkipComponents3",&local_51);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)varyings,
               &local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void XFBGetProgramResourceAPITest::insertSkipComponents(int num_components, Utils::Program::NameVector& varyings)
{
	int num_component_4 = num_components / 4;
	int num_component_1 = num_components % 4;
	for (int i = 0; i < num_component_4; i++)
	{
		varyings.push_back("gl_SkipComponents4");
	}
	switch (num_component_1)
	{
	case 1:
		varyings.push_back("gl_SkipComponents1");
		break;
	case 2:
		varyings.push_back("gl_SkipComponents2");
		break;
	case 3:
		varyings.push_back("gl_SkipComponents3");
		break;
	default:
		break;
	}
}